

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

void prsdef(prscxdef *ctx,tokdef *tok,int typ)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  toktdef *tab;
  char *in_stack_ffffffffffffffc8;
  errcxdef *in_stack_ffffffffffffffd0;
  prscxdef *tok_00;
  prscxdef *ctx_00;
  
  if (in_EDX == 0xc) {
    tok_00 = *(prscxdef **)(in_RDI + 0x18);
  }
  else {
    tok_00 = *(prscxdef **)(in_RDI + 0x10);
  }
  ctx_00 = tok_00;
  if ((*in_RSI == 0x38) && ((char)in_RSI[0x10] == '\0')) {
    if (tok_00 == (prscxdef *)0x0) {
      errsigf(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
    }
    iVar2 = (*(code *)tok_00->prscxtok)(tok_00,in_RSI + 6,in_RSI[1],in_RSI[5],in_RSI + 0x10);
    if (iVar2 == 0) {
      (*(code *)ctx_00->prscxerr)(ctx_00,in_RSI + 6,in_RSI[1],0,0,in_RSI[5]);
      (*(code *)ctx_00->prscxtok)(ctx_00,in_RSI + 6,in_RSI[1],in_RSI[5],in_RSI + 0x10);
    }
  }
  if ((*in_RSI == 0x38) && ((char)in_RSI[0x10] == '\0')) {
    if (ctx_00 == (prscxdef *)0x0) {
      errsigf(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
    }
    switch((emtcxdef *)(ulong)(in_EDX - 3)) {
    case (emtcxdef *)0x0:
      iVar2 = *(int *)(in_RDI + 0x84);
      *(int *)(in_RDI + 0x84) = iVar2 + 1;
      *(short *)((long)in_RSI + 0x42) = (short)iVar2;
      break;
    case (emtcxdef *)0x4:
    case (emtcxdef *)0x5:
      prsdefobj(ctx_00,(tokdef *)tok_00,0);
      break;
    case (emtcxdef *)0x7:
      sVar1 = *(short *)(in_RDI + 0xc2);
      *(short *)(in_RDI + 0xc2) = sVar1 + 1;
      *(short *)((long)in_RSI + 0x42) = sVar1;
      break;
    case (emtcxdef *)0x9:
      uVar3 = emtglbl((emtcxdef *)(ulong)(in_EDX - 3));
      *(short *)((long)in_RSI + 0x42) = (short)uVar3;
    }
    *(char *)(in_RSI + 0x10) = (char)in_EDX;
    (*(code *)ctx_00->prscxstab)(ctx_00,in_RSI + 0x10);
  }
  return;
}

Assistant:

void prsdef(prscxdef *ctx, tokdef *tok, int typ)
{
    toktdef *tab;
    
    tab = (typ == TOKSTLABEL ? ctx->prscxgtab : ctx->prscxstab);
    
    if (tok->toktyp == TOKTSYMBOL && tok->toksym.tokstyp == TOKSTUNK)
    {
        if (!tab) errsig(ctx->prscxerr, ERR_UNDFSYM);
                         
        /* see if it's been defined since we last looked */
        if (!(*tab->toktfsea)(tab, tok->toknam, tok->toklen,
                              tok->tokhash, &tok->toksym))
        {
            /* still not defined; add to the symbol table */
            (*tab->toktfadd)(tab, tok->toknam, tok->toklen,
                             TOKSTUNK, 0, tok->tokhash);
            (*tab->toktfsea)(tab, tok->toknam, tok->toklen,
                             tok->tokhash, &tok->toksym);
        }
    }
    if (tok->toktyp == TOKTSYMBOL && tok->toksym.tokstyp == TOKSTUNK)
    {
        if (!tab) errsig(ctx->prscxerr, ERR_UNDFSYM);

        switch(typ)
        {
        case TOKSTPROP:
            tok->toksym.toksval = ctx->prscxprp++;
            break;

        case TOKSTFWDOBJ:
        case TOKSTFWDFN:
            /* fill in the symbol with the object information */
            prsdefobj(ctx, tok, typ);
            break;

        case TOKSTEXTERN:
            tok->toksym.toksval = ctx->prscxextc++;
            break;
            
        case TOKSTLABEL:
            tok->toksym.toksval = emtglbl(ctx->prscxemt);
            break;
        }
        tok->toksym.tokstyp = typ;
        (*tab->toktfset)(tab, &tok->toksym);
    }
}